

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

CTcMacroRsc * __thiscall CTcTokenizer::alloc_macro_rsc(CTcTokenizer *this)

{
  CTcMacroRsc *in_RDI;
  CTcMacroRsc *rsc;
  CTcMacroRsc *this_00;
  CTcMacroRsc *local_8;
  
  if (in_RDI[0x1e].macro_exp_.buf_size_ == 0) {
    this_00 = in_RDI;
    local_8 = (CTcMacroRsc *)operator_new(0x70);
    CTcMacroRsc::CTcMacroRsc(this_00);
    if (local_8 == (CTcMacroRsc *)0x0) {
      log_error(0x2739);
      local_8 = (CTcMacroRsc *)0x0;
    }
    else {
      local_8->next_ = (CTcMacroRsc *)in_RDI[0x1e].macro_exp_.buf_;
      in_RDI[0x1e].macro_exp_.buf_ = (char *)local_8;
    }
  }
  else {
    local_8 = (CTcMacroRsc *)in_RDI[0x1e].macro_exp_.buf_size_;
    in_RDI[0x1e].macro_exp_.buf_size_ = *(size_t *)(in_RDI[0x1e].macro_exp_.buf_size_ + 0x60);
  }
  return local_8;
}

Assistant:

CTcMacroRsc *CTcTokenizer::alloc_macro_rsc()
{
    CTcMacroRsc *rsc;
    
    /* 
     *   if there's anything in the available list, take the first item
     *   off the list and return it 
     */
    if (macro_res_avail_ != 0)
    {
        /* remember the item to return */
        rsc = macro_res_avail_;

        /* remove it from the list */
        macro_res_avail_ = macro_res_avail_->next_avail_;

        /* return it */
        return rsc;
    }

    /* there's nothing on the available list - allocate a new item */
    rsc = new CTcMacroRsc();

    /* if that failed, return failure */
    if (rsc == 0)
    {
        log_error(TCERR_OUT_OF_MEM_MAC_EXP);
        return 0;
    }

    /* add it onto the master list */
    rsc->next_ = macro_res_head_;
    macro_res_head_ = rsc;

    /* return it */
    return rsc;
}